

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O1

int formulateLP_highs(HighsLp *lp,double **cost,int *nCols,int *nRows,int *nnz,int *nEqs,
                     int **csc_beg,int **csc_idx,double **csc_val,double **rhs,double **lower,
                     double **upper,double *offset,double *sense_origin,int *nCols_origin,
                     int **constraint_new_idx,int **constraint_type)

{
  size_t __size;
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  double *pdVar12;
  double *pdVar13;
  pointer pdVar14;
  double *pdVar15;
  int *piVar16;
  int *piVar17;
  long lVar18;
  double *pdVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  double dVar27;
  
  uVar2 = lp->num_col_;
  uVar25 = (ulong)uVar2;
  uVar3 = lp->num_row_;
  lVar24 = (long)(int)uVar2;
  piVar5 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar23 = piVar5[lVar24];
  *nCols_origin = uVar2;
  *nRows = uVar3;
  *nCols = uVar2;
  *nEqs = 0;
  *nnz = iVar23;
  *offset = lp->offset_;
  if (lp->sense_ == kMinimize) {
    dVar27 = 1.0;
  }
  else {
    if (lp->sense_ != kMaximize) goto LAB_002f99b2;
    dVar27 = -1.0;
  }
  *sense_origin = dVar27;
LAB_002f99b2:
  pdVar6 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar8 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar23 = *nRows;
  piVar17 = (int *)malloc((long)iVar23 << 2);
  *constraint_type = piVar17;
  piVar17 = (int *)malloc((long)iVar23 << 2);
  *constraint_new_idx = piVar17;
  if (0 < (int)uVar3) {
    uVar26 = 0;
    do {
      dVar27 = pdVar6[uVar26];
      dVar1 = pdVar7[uVar26];
      if (((1e+20 <= dVar1 || dVar27 <= -1e+20) || (dVar27 != dVar1)) || (NAN(dVar27) || NAN(dVar1))
         ) {
        if ((dVar27 <= -1e+20) || (dVar1 < 1e+20)) {
          if (-1e+20 < dVar27 || 1e+20 <= dVar1) {
            if (1e+20 <= dVar1 || dVar27 <= -1e+20) {
              printf("Warning: constraint %d has no lower and upper bound\n",uVar26 & 0xffffffff);
            }
            (*constraint_type)[uVar26] = 3;
            *nCols = *nCols + 1;
            *nnz = *nnz + 1;
            goto LAB_002f9aa0;
          }
          (*constraint_type)[uVar26] = 1;
        }
        else {
          (*constraint_type)[uVar26] = 2;
        }
      }
      else {
        (*constraint_type)[uVar26] = 0;
LAB_002f9aa0:
        *nEqs = *nEqs + 1;
      }
      uVar26 = uVar26 + 1;
    } while (uVar3 != uVar26);
  }
  iVar23 = *nCols;
  lVar18 = (long)iVar23;
  __size = lVar18 * 8;
  pdVar19 = (double *)malloc(__size);
  *cost = pdVar19;
  pdVar19 = (double *)malloc(__size);
  *lower = pdVar19;
  pdVar19 = (double *)malloc(__size);
  *upper = pdVar19;
  piVar17 = (int *)malloc(lVar18 * 4 + 4);
  *csc_beg = piVar17;
  iVar4 = *nnz;
  piVar17 = (int *)malloc((long)iVar4 * 4);
  *csc_idx = piVar17;
  pdVar19 = (double *)malloc((long)iVar4 << 3);
  *csc_val = pdVar19;
  iVar4 = *nRows;
  pdVar19 = (double *)malloc((long)iVar4 * 8);
  *rhs = pdVar19;
  if (0 < (int)uVar2) {
    pdVar10 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = *cost;
    pdVar13 = *lower;
    pdVar14 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar15 = *upper;
    uVar26 = 0;
    do {
      pdVar12[uVar26] = pdVar10[uVar26] * *sense_origin;
      pdVar13[uVar26] = pdVar11[uVar26];
      pdVar15[uVar26] = pdVar14[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar25 != uVar26);
  }
  if ((int)uVar2 < iVar23) {
    memset(*cost + lVar24,0,(ulong)(~uVar2 + iVar23) * 8 + 8);
  }
  if (0 < iVar4) {
    piVar17 = *constraint_type;
    lVar20 = 0;
    uVar26 = uVar25;
    do {
      if (piVar17[lVar20] == 3) {
        iVar22 = (int)uVar26;
        (*lower)[iVar22] = pdVar6[lVar20];
        (*upper)[iVar22] = pdVar7[lVar20];
        uVar26 = (ulong)(iVar22 + 1);
      }
      lVar20 = lVar20 + 1;
    } while (iVar4 != lVar20);
  }
  if (0 < iVar23) {
    pdVar12 = *lower;
    pdVar13 = *upper;
    lVar20 = 0;
    do {
      pdVar15 = pdVar12 + lVar20;
      if (*pdVar15 <= -1e+20 && *pdVar15 != -1e+20) {
        pdVar12[lVar20] = -INFINITY;
      }
      if (1e+20 < pdVar13[lVar20]) {
        pdVar13[lVar20] = INFINITY;
      }
      lVar20 = lVar20 + 1;
    } while (lVar18 != lVar20);
  }
  if (0 < *nRows) {
    piVar17 = *constraint_type;
    lVar18 = 0;
    iVar23 = 0;
    do {
      if (piVar17[lVar18] == 3) {
        dVar27 = 0.0;
LAB_002f9dc1:
        pdVar19[iVar23] = dVar27;
        (*constraint_new_idx)[lVar18] = iVar23;
        iVar23 = iVar23 + 1;
      }
      else if (piVar17[lVar18] == 0) {
        dVar27 = pdVar6[lVar18];
        goto LAB_002f9dc1;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < *nRows);
  }
  if (0 < *nRows) {
    iVar23 = *nEqs;
    piVar17 = *constraint_type;
    lVar18 = 0;
    do {
      if (piVar17[lVar18] == 2) {
        dVar27 = pdVar6[lVar18];
LAB_002f9e22:
        pdVar19[iVar23] = dVar27;
        (*constraint_new_idx)[lVar18] = iVar23;
        iVar23 = iVar23 + 1;
      }
      else if (piVar17[lVar18] == 1) {
        dVar27 = -pdVar7[lVar18];
        goto LAB_002f9e22;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < *nRows);
  }
  if (-1 < (int)uVar2) {
    piVar17 = *csc_beg;
    lVar18 = 0;
    do {
      piVar17[lVar18] = piVar5[lVar18];
      lVar18 = lVar18 + 1;
    } while (uVar25 + 1 != lVar18);
  }
  if ((int)uVar2 < *nCols) {
    piVar17 = *csc_beg;
    iVar23 = piVar17[lVar24];
    do {
      iVar23 = iVar23 + 1;
      piVar17[lVar24 + 1] = iVar23;
      lVar24 = lVar24 + 1;
    } while (lVar24 < *nCols);
  }
  if (0 < (int)uVar2) {
    piVar17 = *csc_beg;
    iVar23 = 0;
    uVar26 = 0;
    do {
      lVar24 = (long)piVar17[uVar26];
      uVar21 = uVar26 + 1;
      if (piVar17[uVar26] < piVar17[uVar26 + 1]) {
        piVar16 = *constraint_type;
        do {
          iVar4 = piVar8[lVar24];
          if ((piVar16[iVar4] == 3) || (piVar16[iVar4] == 0)) {
            (*csc_idx)[iVar23] = (*constraint_new_idx)[iVar4];
            (*csc_val)[iVar23] = pdVar9[lVar24];
            iVar23 = iVar23 + 1;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < piVar17[uVar21]);
      }
      lVar24 = (long)piVar17[uVar26];
      if (piVar17[uVar26] < piVar17[uVar21]) {
        piVar16 = *constraint_type;
        do {
          iVar4 = piVar8[lVar24];
          if (piVar16[iVar4] == 2) {
            (*csc_idx)[iVar23] = (*constraint_new_idx)[iVar4];
            dVar27 = pdVar9[lVar24];
LAB_002f9f6d:
            (*csc_val)[iVar23] = dVar27;
            iVar23 = iVar23 + 1;
          }
          else if (piVar16[iVar4] == 1) {
            (*csc_idx)[iVar23] = (*constraint_new_idx)[iVar4];
            dVar27 = -pdVar9[lVar24];
            goto LAB_002f9f6d;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < piVar17[uVar21]);
      }
      uVar26 = uVar21;
    } while (uVar21 != uVar25);
  }
  if (0 < *nRows) {
    piVar17 = *constraint_type;
    lVar24 = 0;
    do {
      if (piVar17[lVar24] == 3) {
        piVar16 = *csc_beg;
        iVar23 = (int)uVar25;
        (*csc_idx)[piVar16[iVar23]] = (*constraint_new_idx)[lVar24];
        (*csc_val)[piVar16[iVar23]] = -1.0;
        uVar25 = (ulong)(iVar23 + 1);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < *nRows);
  }
  return 0;
}

Assistant:

int formulateLP_highs(const HighsLp& lp, double** cost, int* nCols, int* nRows,
                      int* nnz, int* nEqs, int** csc_beg, int** csc_idx,
                      double** csc_val, double** rhs, double** lower,
                      double** upper, double* offset, double* sense_origin,
                      int* nCols_origin, int** constraint_new_idx,
                      int** constraint_type) {
  int retcode = 0;

  // problem size for malloc
  int nCols_clp = lp.num_col_;
  int nRows_clp = lp.num_row_;
  int nnz_clp = lp.a_matrix_.start_[lp.num_col_];
  *nCols_origin = nCols_clp;
  *nRows = nRows_clp;    // need not recalculate
  *nCols = nCols_clp;    // need recalculate
  *nEqs = 0;             // need recalculate
  *nnz = nnz_clp;        // need recalculate
  *offset = lp.offset_;  // need not recalculate
  if (lp.sense_ == ObjSense::kMinimize) {
    *sense_origin = 1.0;
  } else if (lp.sense_ == ObjSense::kMaximize) {
    *sense_origin = -1.0;
  }

  const double* lhs_clp = lp.row_lower_.data();
  const double* rhs_clp = lp.row_upper_.data();
  const HighsInt* A_csc_beg = lp.a_matrix_.start_.data();
  const HighsInt* A_csc_idx = lp.a_matrix_.index_.data();
  const double* A_csc_val = lp.a_matrix_.value_.data();
  int has_lower, has_upper;

  cupdlp_init_int(*constraint_type, *nRows);
  cupdlp_init_int(*constraint_new_idx, *nRows);

  // recalculate nRows and nnz for Ax - z = 0
  for (int i = 0; i < nRows_clp; i++) {
    has_lower = lhs_clp[i] > -1e20;
    has_upper = rhs_clp[i] < 1e20;

    // count number of equations and rows
    if (has_lower && has_upper && lhs_clp[i] == rhs_clp[i]) {
      (*constraint_type)[i] = EQ;
      (*nEqs)++;
    } else if (has_lower && !has_upper) {
      (*constraint_type)[i] = GEQ;
    } else if (!has_lower && has_upper) {
      (*constraint_type)[i] = LEQ;
    } else if (has_lower && has_upper) {
      (*constraint_type)[i] = BOUND;
      (*nCols)++;
      (*nnz)++;
      (*nEqs)++;
    } else {
      // printf("Error: constraint %d has no lower and upper bound\n", i);
      // retcode = 1;
      // goto exit_cleanup;

      // what if regard free as bounded
      printf("Warning: constraint %d has no lower and upper bound\n", i);
      (*constraint_type)[i] = BOUND;
      (*nCols)++;
      (*nnz)++;
      (*nEqs)++;
    }
  }

  // allocate memory
  cupdlp_init_double(*cost, *nCols);
  cupdlp_init_double(*lower, *nCols);
  cupdlp_init_double(*upper, *nCols);
  cupdlp_init_int(*csc_beg, *nCols + 1);
  cupdlp_init_int(*csc_idx, *nnz);
  cupdlp_init_double(*csc_val, *nnz);
  cupdlp_init_double(*rhs, *nRows);

  // cost, lower, upper
  for (int i = 0; i < nCols_clp; i++) {
    (*cost)[i] = lp.col_cost_[i] * (*sense_origin);
    (*lower)[i] = lp.col_lower_[i];

    (*upper)[i] = lp.col_upper_[i];
  }
  // slack costs
  for (int i = nCols_clp; i < *nCols; i++) {
    (*cost)[i] = 0.0;
  }
  // slack bounds
  for (int i = 0, j = nCols_clp; i < *nRows; i++) {
    if ((*constraint_type)[i] == BOUND) {
      (*lower)[j] = lhs_clp[i];
      (*upper)[j] = rhs_clp[i];
      j++;
    }
  }

  for (int i = 0; i < *nCols; i++) {
    if ((*lower)[i] < -1e20) (*lower)[i] = -INFINITY;
    if ((*upper)[i] > 1e20) (*upper)[i] = INFINITY;
  }

  // permute LP rhs
  // EQ or BOUND first
  for (int i = 0, j = 0; i < *nRows; i++) {
    if ((*constraint_type)[i] == EQ) {
      (*rhs)[j] = lhs_clp[i];
      (*constraint_new_idx)[i] = j;
      j++;
    } else if ((*constraint_type)[i] == BOUND) {
      (*rhs)[j] = 0.0;
      (*constraint_new_idx)[i] = j;
      j++;
    }
  }
  // then LEQ or GEQ
  for (int i = 0, j = *nEqs; i < *nRows; i++) {
    if ((*constraint_type)[i] == LEQ) {
      (*rhs)[j] = -rhs_clp[i];  // multiply -1
      (*constraint_new_idx)[i] = j;
      j++;
    } else if ((*constraint_type)[i] == GEQ) {
      (*rhs)[j] = lhs_clp[i];
      (*constraint_new_idx)[i] = j;
      j++;
    }
  }

  // formulate and permute LP matrix
  // beg remains the same
  for (int i = 0; i < nCols_clp + 1; i++) (*csc_beg)[i] = A_csc_beg[i];
  for (int i = nCols_clp + 1; i < *nCols + 1; i++)
    (*csc_beg)[i] = (*csc_beg)[i - 1] + 1;

  // row idx changes
  for (int i = 0, k = 0; i < nCols_clp; i++) {
    // same order as in rhs
    // EQ or BOUND first
    for (int j = (*csc_beg)[i]; j < (*csc_beg)[i + 1]; j++) {
      if ((*constraint_type)[A_csc_idx[j]] == EQ ||
          (*constraint_type)[A_csc_idx[j]] == BOUND) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = A_csc_val[j];
        k++;
      }
    }
    // then LEQ or GEQ
    for (int j = (*csc_beg)[i]; j < (*csc_beg)[i + 1]; j++) {
      if ((*constraint_type)[A_csc_idx[j]] == LEQ) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = -A_csc_val[j];  // multiply -1
        k++;
      } else if ((*constraint_type)[A_csc_idx[j]] == GEQ) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = A_csc_val[j];
        k++;
      }
    }
  }

  // slacks for BOUND
  for (int i = 0, j = nCols_clp; i < *nRows; i++) {
    if ((*constraint_type)[i] == BOUND) {
      (*csc_idx)[(*csc_beg)[j]] = (*constraint_new_idx)[i];
      (*csc_val)[(*csc_beg)[j]] = -1.0;
      j++;
    }
  }

  return retcode;
}